

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcAnnotation::IfcAnnotation(IfcAnnotation *this)

{
  *(undefined ***)&(this->super_IfcProduct).field_0x110 = &PTR__Object_00814a00;
  *(undefined8 *)&this->field_0x118 = 0;
  *(char **)&this->field_0x120 = "IfcAnnotation";
  IfcProduct::IfcProduct(&this->super_IfcProduct,&PTR_construction_vtable_24__00885528);
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject = 0x885448;
  *(undefined8 *)&(this->super_IfcProduct).field_0x110 = 0x885510;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0x88 = 0x885470;
  (this->super_IfcProduct).super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x885498;
  *(undefined8 *)&(this->super_IfcProduct).super_IfcObject.field_0xd0 = 0x8854c0;
  *(undefined8 *)&(this->super_IfcProduct).field_0x100 = 0x8854e8;
  return;
}

Assistant:

IfcAnnotation() : Object("IfcAnnotation") {}